

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_listen_on_data_tls_alpn(intptr_t uuid,fio_protocol_s *pr_)

{
  intptr_t uuid_00;
  int iVar1;
  
  iVar1 = 4;
  do {
    uuid_00 = fio_accept(uuid);
    if (uuid_00 == -1) {
      return;
    }
    fio_tls_accept(uuid_00,pr_[2].on_close,pr_[1].on_ready);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return;
}

Assistant:

static void fio_listen_on_data_tls_alpn(intptr_t uuid, fio_protocol_s *pr_) {
  fio_listen_protocol_s *pr = (fio_listen_protocol_s *)pr_;
  for (int i = 0; i < 4; ++i) {
    intptr_t client = fio_accept(uuid);
    if (client == -1)
      return;
    fio_tls_accept(client, pr->tls, pr->udata);
  }
}